

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O1

void amrex::average_cellcenter_to_face
               (Array<MultiFab_*,_3> *fc,MultiFab *cc,Geometry *geom,int ncomp,
               bool use_harmonic_averaging)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Array<MultiFab_*,_3> *pAVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  MFIter mfi;
  int local_298;
  int local_294;
  Box local_28c;
  Box local_270;
  Box local_254;
  ulong local_238;
  ulong local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  double *local_208;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  ulong local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  ulong local_1d0;
  double *local_1c8;
  Array<MultiFab_*,_3> *local_1c0;
  FabArray<amrex::FArrayBox> *local_1b8;
  ulong local_1b0;
  long local_1a8;
  long local_1a0;
  double *local_198;
  Array4<double> local_190;
  Array4<const_double> local_150;
  Array4<double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  local_1c0 = fc;
  local_1b8 = &cc->super_FabArray<amrex::FArrayBox>;
  MFIter::MFIter(&local_90,(FabArrayBase *)cc,true);
  if (local_90.currentIndex < local_90.endIndex) {
    local_1b0 = (ulong)(uint)ncomp;
    do {
      MFIter::nodaltilebox(&local_254,&local_90,0);
      MFIter::nodaltilebox(&local_270,&local_90,1);
      MFIter::nodaltilebox(&local_28c,&local_90,2);
      pAVar12 = local_1c0;
      iVar11 = local_254.bigend.vect[2];
      iVar10 = local_254.bigend.vect[1];
      iVar9 = local_254.bigend.vect[0];
      iVar8 = local_254.smallend.vect[0];
      iVar13 = local_270.bigend.vect[2];
      iVar14 = local_270.bigend.vect[1];
      iVar18 = local_270.bigend.vect[0];
      iVar15 = local_270.smallend.vect[0];
      iVar7 = local_28c.bigend.vect[2];
      iVar6 = local_28c.bigend.vect[1];
      iVar26 = local_28c.bigend.vect[0];
      iVar20 = local_28c.smallend.vect[0];
      uVar17 = local_270.smallend.vect[1];
      if (local_254.smallend.vect[1] < local_270.smallend.vect[1]) {
        uVar17 = local_254.smallend.vect[1];
      }
      uVar3 = local_270.smallend.vect[2];
      if (local_254.smallend.vect[2] < local_270.smallend.vect[2]) {
        uVar3 = local_254.smallend.vect[2];
      }
      if (local_28c.smallend.vect[1] <= (int)uVar17) {
        uVar17 = local_28c.smallend.vect[1];
      }
      local_238 = (ulong)uVar17;
      if (local_28c.smallend.vect[2] <= (int)uVar3) {
        uVar3 = local_28c.smallend.vect[2];
      }
      local_1f0 = (ulong)uVar3;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,&local_1c0->_M_elems[0]->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_190,&pAVar12->_M_elems[1]->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_110,&pAVar12->_M_elems[2]->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_150,local_1b8,&local_90);
      auVar5 = _DAT_006a2260;
      if (0 < ncomp) {
        if (iVar13 < iVar11) {
          iVar13 = iVar11;
        }
        if (iVar13 <= iVar7) {
          iVar13 = iVar7;
        }
        if (iVar14 < iVar10) {
          iVar14 = iVar10;
        }
        if (iVar14 <= iVar6) {
          iVar14 = iVar6;
        }
        if (iVar18 < iVar9) {
          iVar18 = iVar9;
        }
        if (iVar18 <= iVar26) {
          iVar18 = iVar26;
        }
        if (iVar8 < iVar15) {
          iVar15 = iVar8;
        }
        if (iVar20 <= iVar15) {
          iVar15 = iVar20;
        }
        local_1e8 = (long)iVar15;
        local_1a8 = local_1e8 * 8;
        local_1f8 = (int)local_238 + -1;
        local_1fc = (int)local_1f0 + -1;
        local_1f4 = iVar15 + -1;
        local_218 = 0;
        local_230 = 0;
        do {
          uVar21 = local_1f0 & 0xffffffff;
          local_298 = local_1fc;
          if ((int)local_1f0 <= iVar13) {
            do {
              iVar20 = (int)uVar21;
              if ((int)local_238 <= iVar14) {
                local_210 = (long)iVar20;
                uVar21 = local_238;
                local_294 = local_1f8;
                do {
                  iVar26 = (int)uVar21;
                  if (iVar15 <= iVar18) {
                    local_1e0 = (long)iVar26;
                    local_1c8 = local_150.p +
                                local_150.jstride * (local_1e0 - local_150.begin.y) +
                                local_150.kstride * (local_210 - local_150.begin.z) +
                                local_150.nstride * local_230;
                    lVar19 = (local_1e0 - local_d0.begin.y) * local_d0.jstride;
                    lVar23 = (local_210 - local_d0.begin.z) * local_d0.kstride;
                    lVar16 = (local_210 - local_150.begin.z) * local_150.kstride * 8;
                    lVar24 = (local_1e0 - local_150.begin.y) * local_150.jstride * 8;
                    lVar22 = local_150.nstride * local_218;
                    local_1a0 = (long)local_254.smallend.vect[0];
                    lVar25 = (long)local_150.begin.x;
                    uVar17 = local_1f4 - local_150.begin.x;
                    local_1d0 = (ulong)uVar17;
                    lVar4 = lVar16 + lVar24 + lVar22 + lVar25 * -8 + local_1a8;
                    lVar16 = lVar16 + lVar22 +
                             (long)(local_294 - local_150.begin.y) * local_150.jstride * 8 +
                             lVar25 * -8 + local_1a8;
                    local_1d8 = (long)local_150.p +
                                lVar22 + lVar24 +
                                (long)(local_298 - local_150.begin.z) * local_150.kstride * 8 +
                                lVar25 * -8 + local_1a8;
                    lVar22 = local_110.nstride * local_218 +
                             (local_1e0 - local_110.begin.y) * local_110.jstride * 8 +
                             (local_210 - local_110.begin.z) * local_110.kstride * 8 +
                             (long)local_110.begin.x * -8 + local_1a8;
                    local_220 = (long)local_d0.p +
                                local_d0.nstride * local_218 + lVar19 * 8 + lVar23 * 8 +
                                (long)local_d0.begin.x * -8 + local_1a8;
                    local_198 = local_190.p + local_1e8;
                    local_228 = local_190.nstride * local_218 +
                                (local_210 - local_190.begin.z) * local_190.kstride * 8 +
                                (local_1e0 - local_190.begin.y) * local_190.jstride * 8 +
                                (long)local_190.begin.x * -8 + (long)local_198;
                    local_208 = local_d0.p +
                                lVar19 + lVar23 + local_d0.nstride * local_230 +
                                                  (local_1e8 - local_d0.begin.x);
                    lVar19 = 0;
                    do {
                      lVar23 = local_1e8 + lVar19;
                      if (use_harmonic_averaging) {
                        if ((((local_1a0 <= lVar23) && (lVar23 <= local_254.bigend.vect[0])) &&
                            (local_254.smallend.vect[1] <= iVar26)) &&
                           (((iVar26 <= local_254.bigend.vect[1] &&
                             (local_254.smallend.vect[2] <= iVar20)) &&
                            (iVar20 <= local_254.bigend.vect[2])))) {
                          dVar1 = local_1c8[(int)(uVar17 + (int)lVar19)];
                          dVar28 = 0.0;
                          if ((dVar1 != 0.0) || (NAN(dVar1))) {
                            dVar2 = *(double *)((long)local_150.p + lVar19 * 8 + lVar4);
                            if ((dVar2 != 0.0) || (NAN(dVar2))) {
                              auVar29._8_8_ = dVar2;
                              auVar29._0_8_ = dVar1;
                              auVar29 = divpd(auVar5,auVar29);
                              dVar28 = 2.0 / (auVar29._8_8_ + auVar29._0_8_);
                            }
                          }
                          local_208[lVar19] = dVar28;
                        }
                        if (((((local_270.smallend.vect[0] <= lVar23) &&
                              (lVar23 <= local_270.bigend.vect[0])) &&
                             (local_270.smallend.vect[1] <= iVar26)) &&
                            ((iVar26 <= local_270.bigend.vect[1] &&
                             (local_270.smallend.vect[2] <= iVar20)))) &&
                           (iVar20 <= local_270.bigend.vect[2])) {
                          dVar1 = *(double *)((long)local_150.p + lVar19 * 8 + lVar16);
                          dVar28 = 0.0;
                          if ((dVar1 != 0.0) || (NAN(dVar1))) {
                            dVar2 = *(double *)((long)local_150.p + lVar19 * 8 + lVar4);
                            if ((dVar2 != 0.0) || (NAN(dVar2))) {
                              auVar30._8_8_ = dVar2;
                              auVar30._0_8_ = dVar1;
                              auVar29 = divpd(auVar5,auVar30);
                              dVar28 = 2.0 / (auVar29._8_8_ + auVar29._0_8_);
                            }
                          }
                          *(double *)
                           ((long)local_198 +
                           lVar19 * 8 +
                           local_190.nstride * local_218 +
                           (local_1e0 - local_190.begin.y) * local_190.jstride * 8 +
                           (local_210 - local_190.begin.z) * local_190.kstride * 8 +
                           (long)local_190.begin.x * -8) = dVar28;
                        }
                        if ((((local_28c.smallend.vect[0] <= lVar23) &&
                             (lVar23 <= local_28c.bigend.vect[0])) &&
                            (local_28c.smallend.vect[1] <= iVar26)) &&
                           (((iVar26 <= local_28c.bigend.vect[1] &&
                             (local_28c.smallend.vect[2] <= iVar20)) &&
                            (iVar20 <= local_28c.bigend.vect[2])))) {
                          dVar1 = *(double *)(local_1d8 + lVar19 * 8);
                          if ((dVar1 != 0.0) || (NAN(dVar1))) {
                            dVar28 = *(double *)((long)local_150.p + lVar19 * 8 + lVar4);
                            if ((dVar28 != 0.0) || (NAN(dVar28))) {
                              auVar27._8_8_ = dVar28;
                              auVar27._0_8_ = dVar1;
                              auVar29 = divpd(auVar5,auVar27);
                              *(double *)((long)local_110.p + lVar19 * 8 + lVar22) =
                                   2.0 / (auVar29._8_8_ + auVar29._0_8_);
                              goto LAB_004af52a;
                            }
                          }
                          *(undefined8 *)((long)local_110.p + lVar19 * 8 + lVar22) = 0;
                        }
                      }
                      else {
                        if (((((local_1a0 <= lVar23) && (lVar23 <= local_254.bigend.vect[0])) &&
                             (local_254.smallend.vect[1] <= iVar26)) &&
                            ((iVar26 <= local_254.bigend.vect[1] &&
                             (local_254.smallend.vect[2] <= iVar20)))) &&
                           (iVar20 <= local_254.bigend.vect[2])) {
                          *(double *)(local_220 + lVar19 * 8) =
                               (local_1c8[(int)(uVar17 + (int)lVar19)] +
                               *(double *)((long)local_150.p + lVar19 * 8 + lVar4)) * 0.5;
                        }
                        if (((local_270.smallend.vect[0] <= lVar23) &&
                            (lVar23 <= local_270.bigend.vect[0])) &&
                           ((local_270.smallend.vect[1] <= iVar26 &&
                            (((iVar26 <= local_270.bigend.vect[1] &&
                              (local_270.smallend.vect[2] <= iVar20)) &&
                             (iVar20 <= local_270.bigend.vect[2])))))) {
                          *(double *)(local_228 + lVar19 * 8) =
                               (*(double *)((long)local_150.p + lVar19 * 8 + lVar16) +
                               *(double *)((long)local_150.p + lVar19 * 8 + lVar4)) * 0.5;
                        }
                        if (((local_28c.smallend.vect[0] <= lVar23) &&
                            (lVar23 <= local_28c.bigend.vect[0])) &&
                           (((local_28c.smallend.vect[1] <= iVar26 &&
                             ((iVar26 <= local_28c.bigend.vect[1] &&
                              (local_28c.smallend.vect[2] <= iVar20)))) &&
                            (iVar20 <= local_28c.bigend.vect[2])))) {
                          *(double *)((long)local_110.p + lVar19 * 8 + lVar22) =
                               (*(double *)(local_1d8 + lVar19 * 8) +
                               *(double *)((long)local_150.p + lVar19 * 8 + lVar4)) * 0.5;
                        }
                      }
LAB_004af52a:
                      lVar19 = lVar19 + 1;
                    } while ((iVar18 - iVar15) + 1 != (int)lVar19);
                  }
                  local_294 = local_294 + 1;
                  uVar21 = (ulong)(iVar26 + 1);
                } while (iVar26 != iVar14);
              }
              local_298 = local_298 + 1;
              uVar21 = (ulong)(iVar20 + 1);
            } while (iVar20 != iVar13);
          }
          local_230 = local_230 + 1;
          local_218 = local_218 + 8;
        } while (local_230 != local_1b0);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void average_cellcenter_to_face (const Array<MultiFab*,AMREX_SPACEDIM>& fc, const MultiFab& cc,
                                    const Geometry& geom, int ncomp, bool use_harmonic_averaging)
    {
        AMREX_ASSERT(cc.nComp() == ncomp);
        AMREX_ASSERT(cc.nGrow() >= 1);
        AMREX_ASSERT(fc[0]->nComp() == ncomp); // We only expect fc to have the gradient perpendicular to the face
#if (AMREX_SPACEDIM >= 2)
        AMREX_ASSERT(fc[1]->nComp() == ncomp); // We only expect fc to have the gradient perpendicular to the face
#endif
#if (AMREX_SPACEDIM == 3)
        AMREX_ASSERT(fc[2]->nComp() == ncomp); // We only expect fc to have the gradient perpendicular to the face
#endif


#if (AMREX_SPACEDIM == 1)
        const GeometryData& gd = geom.data();
        if (use_harmonic_averaging) {
            AMREX_ASSERT(gd.Coord() == 0);
        }
#else
        amrex::ignore_unused(geom);
#endif

#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion() && cc.isFusingCandidate()) {
            auto const& ccma = cc.const_arrays();
            AMREX_D_TERM(auto const& fxma = fc[0]->arrays();,
                         auto const& fyma = fc[1]->arrays();,
                         auto const& fzma = fc[2]->arrays(););
            MultiFab foo(amrex::convert(cc.boxArray(),IntVect(1)), cc.DistributionMap(), 1, 0,
                         MFInfo().SetAlloc(false));
            IntVect ng = -cc.nGrowVect();
            ParallelFor(foo, IntVect(0), ncomp,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                Box ccbx(ccma[box_no]);
                ccbx.grow(ng);
                AMREX_D_TERM(Box const& xbx = amrex::surroundingNodes(ccbx,0);,
                             Box const& ybx = amrex::surroundingNodes(ccbx,1);,
                             Box const& zbx = amrex::surroundingNodes(ccbx,2););
#if (AMREX_SPACEDIM == 1)
                amrex_avg_cc_to_fc(i,j,k,n, xbx, fxma[box_no], ccma[box_no], gd, use_harmonic_averaging);
#else
                amrex_avg_cc_to_fc(i,j,k,n, AMREX_D_DECL(xbx,ybx,zbx),
                                   AMREX_D_DECL(fxma[box_no],fyma[box_no],fzma[box_no]),
                                   ccma[box_no], use_harmonic_averaging);
#endif
            });
            Gpu::streamSynchronize();
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(cc,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                AMREX_D_TERM(const Box& xbx = mfi.nodaltilebox(0);,
                             const Box& ybx = mfi.nodaltilebox(1);,
                             const Box& zbx = mfi.nodaltilebox(2););
                const auto& index_bounds = amrex::getIndexBounds(AMREX_D_DECL(xbx,ybx,zbx));

                AMREX_D_TERM(Array4<Real> const& fxarr = fc[0]->array(mfi);,
                             Array4<Real> const& fyarr = fc[1]->array(mfi);,
                             Array4<Real> const& fzarr = fc[2]->array(mfi););
                Array4<Real const> const& ccarr = cc.const_array(mfi);

#if (AMREX_SPACEDIM == 1)
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(index_bounds, ncomp, i, j, k, n,
                {
                    amrex_avg_cc_to_fc(i,j,k,n, xbx, fxarr, ccarr, gd, use_harmonic_averaging);
                });
#else
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(index_bounds, ncomp, i, j, k, n,
                {
                    amrex_avg_cc_to_fc(i,j,k,n, AMREX_D_DECL(xbx,ybx,zbx),
                                       AMREX_D_DECL(fxarr,fyarr,fzarr), ccarr,
                                       use_harmonic_averaging);
                });
#endif
            }
        }
    }